

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

double __thiscall r_exec::Group::update_res(Group *this,View *v)

{
  uint16_t uVar1;
  uint uVar2;
  Code *pCVar3;
  _Mem *this_00;
  View *view;
  Group *destination;
  _Mem *m;
  Code *object;
  float fVar4;
  float fVar5;
  double dVar6;
  ushort local_28;
  uint16_t i;
  uint16_t ntf_grp_count;
  float res;
  View *v_local;
  Group *this_local;
  
  pCVar3 = core::P<r_code::Code>::operator->(&(v->super_View).object);
  uVar2 = (*(pCVar3->super__Object)._vptr__Object[0xe])();
  if ((uVar2 & 1) == 0) {
    dVar6 = View::update_res(v);
    fVar4 = (float)dVar6;
    uVar2 = (*(v->super_View).super__Object._vptr__Object[2])();
    if ((((uVar2 & 1) == 0) && (0.0 < fVar4)) && (fVar5 = get_low_res_thr(this), fVar4 < fVar5)) {
      uVar1 = get_ntf_grp_count(this);
      for (local_28 = 1; local_28 <= uVar1; local_28 = local_28 + 1) {
        this_00 = _Mem::Get();
        view = (View *)operator_new(0x100);
        destination = get_ntf_grp(this,local_28);
        pCVar3 = (Code *)operator_new(0x150);
        m = _Mem::Get();
        object = core::P::operator_cast_to_Code_((P *)&(v->super_View).object);
        MkLowRes::MkLowRes((MkLowRes *)pCVar3,&m->super_Mem,object);
        NotificationView::NotificationView
                  ((NotificationView *)view,(Code *)this,(Code *)destination,pCVar3);
        _Mem::inject_notification(this_00,view,false);
      }
    }
    this_local = (Group *)(double)fVar4;
  }
  else {
    this_local = (Group *)0x0;
  }
  return (double)this_local;
}

Assistant:

double Group::update_res(View *v)
{
    if (v->object->is_invalidated()) {
        return 0;
    }

    float res = v->update_res();

    if (!v->isNotification() && res > 0 && res < get_low_res_thr()) {
        uint16_t ntf_grp_count = get_ntf_grp_count();

        for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
            _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkLowRes(_Mem::Get(), v->object)), false);
        }
    }

    return res;
}